

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O1

void nghttp2_map_each_free(nghttp2_map *map,_func_int_void_ptr_void_ptr *func,void *ptr)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  
  if (map->tablelen != 0) {
    lVar2 = 8;
    uVar3 = 0;
    do {
      pvVar1 = *(void **)((long)&map->table->hash + lVar2);
      if (pvVar1 != (void *)0x0) {
        (*func)(pvVar1,ptr);
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < map->tablelen);
  }
  return;
}

Assistant:

void nghttp2_map_each_free(nghttp2_map *map, int (*func)(void *data, void *ptr),
                           void *ptr) {
  uint32_t i;
  nghttp2_map_bucket *bkt;

  for (i = 0; i < map->tablelen; ++i) {
    bkt = &map->table[i];

    if (bkt->data == NULL) {
      continue;
    }

    func(bkt->data, ptr);
  }
}